

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImVec2 __thiscall
ImFont::CalcTextSizeA
          (ImFont *this,float size,float max_width,float wrap_width,char *text_begin,char *text_end,
          char **remaining)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  ImVec2 IVar11;
  uint c;
  uint local_64;
  float local_60;
  float local_5c;
  float local_58;
  uint uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  float fStack_44;
  uint uStack_40;
  float fStack_3c;
  
  local_5c = max_width;
  if (text_end == (char *)0x0) {
    sVar4 = strlen(text_begin);
    text_end = text_begin + sVar4;
  }
  if (text_begin < text_end) {
    local_60 = size / this->FontSize;
    local_48 = 0.0;
    uStack_40 = 0;
    fStack_3c = 0.0;
    pcVar5 = (char *)0x0;
    local_58 = 0.0;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    fStack_44 = 0.0;
    do {
      if (wrap_width <= 0.0) {
LAB_001580d8:
        local_64 = (uint)*text_begin;
        if (*text_begin < '\0') {
          iVar3 = ImTextCharFromUtf8(&local_64,text_begin,text_end);
          pcVar6 = text_begin + iVar3;
          if (local_64 != 0) goto LAB_00158128;
          bVar2 = true;
          text_begin = pcVar6;
          fVar10 = fStack_44;
        }
        else {
          pcVar6 = text_begin + 1;
LAB_00158128:
          uVar7 = (ulong)local_64;
          fVar10 = fStack_44;
          if (uVar7 < 0x20) {
            if (uVar7 == 0xd) {
              bVar2 = false;
              text_begin = pcVar6;
            }
            else {
              if (local_64 != 10) goto LAB_0015816f;
              uStack_40 = uStack_54 & (uint)fStack_44;
              local_48 = (float)(~-(uint)(local_58 <= local_48) & (uint)local_58 |
                                -(uint)(local_58 <= local_48) & (uint)local_48);
              uStack_54 = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              bVar2 = false;
              text_begin = pcVar6;
              fVar10 = fStack_44 + size;
              fStack_3c = fStack_44;
              local_58 = 0.0;
            }
          }
          else {
LAB_0015816f:
            pfVar8 = (this->IndexAdvanceX).Data + uVar7;
            if ((this->IndexAdvanceX).Size <= (int)local_64) {
              pfVar8 = &this->FallbackAdvanceX;
            }
            fVar9 = *pfVar8 * local_60 + local_58;
            bVar2 = local_5c <= fVar9;
            if (!bVar2) {
              uStack_54 = 0;
              uStack_50 = 0;
              uStack_4c = 0;
              text_begin = pcVar6;
              local_58 = fVar9;
            }
          }
        }
        if (bVar2) break;
      }
      else {
        if (pcVar5 == (char *)0x0) {
          pcVar5 = CalcWordWrapPositionA(this,local_60,text_begin,text_end,wrap_width - local_58);
          pcVar5 = pcVar5 + (pcVar5 == text_begin);
        }
        if (text_begin < pcVar5) goto LAB_001580d8;
        if (local_48 < local_58) {
          local_48 = local_58;
        }
        fVar10 = fStack_44 + size;
        local_58 = 0.0;
        uStack_54 = 0;
        uStack_50 = 0;
        uStack_4c = 0;
        do {
          if (text_end <= text_begin) break;
          cVar1 = *text_begin;
          text_begin = text_begin + ((byte)(cVar1 - 9U) < 2 || cVar1 == ' ');
        } while ((cVar1 == ' ') || (cVar1 == '\t'));
        pcVar5 = (char *)0x0;
      }
      fStack_44 = fVar10;
    } while (text_begin < text_end);
  }
  else {
    local_58 = 0.0;
    local_48 = 0.0;
    fVar10 = 0.0;
  }
  if (remaining != (char **)0x0) {
    *remaining = text_begin;
  }
  if (local_48 < local_58) {
    local_48 = local_58;
  }
  if (fVar10 == 0.0 || 0.0 < local_58) {
    fVar10 = fVar10 + size;
  }
  IVar11.y = fVar10;
  IVar11.x = local_48;
  return IVar11;
}

Assistant:

ImVec2 ImFont::CalcTextSizeA(float size, float max_width, float wrap_width, const char* text_begin, const char* text_end, const char** remaining) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // FIXME-OPT: Need to avoid this.

    const float line_height = size;
    const float scale = size / FontSize;

    ImVec2 text_size = ImVec2(0,0);
    float line_width = 0.0f;

    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    const char* s = text_begin;
    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - line_width);
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                if (text_size.x < line_width)
                    text_size.x = line_width;
                text_size.y += line_height;
                line_width = 0.0f;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        const char* prev_s = s;
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                text_size.x = ImMax(text_size.x, line_width);
                text_size.y += line_height;
                line_width = 0.0f;
                continue;
            }
            if (c == '\r')
                continue;
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX) * scale;
        if (line_width + char_width >= max_width)
        {
            s = prev_s;
            break;
        }

        line_width += char_width;
    }

    if (text_size.x < line_width)
        text_size.x = line_width;

    if (line_width > 0 || text_size.y == 0.0f)
        text_size.y += line_height;

    if (remaining)
        *remaining = s;

    return text_size;
}